

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O1

int compare_timers(void *av,void *bv)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  lVar2 = *(long *)((long)av + 0x10) - now;
  lVar4 = *(long *)((long)bv + 0x10) - now;
  iVar1 = -1;
  if ((lVar4 <= lVar2) && (iVar1 = 1, lVar2 <= lVar4)) {
    uVar3 = *av;
    uVar5 = *bv;
    uVar3 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    uVar5 = uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
            (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
            (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    iVar1 = (uint)(uVar5 < uVar3) - (uint)(uVar3 < uVar5);
    if (iVar1 == 0) {
      iVar1 = -1;
      if (*(ulong *)((long)bv + 8) <= *(ulong *)((long)av + 8)) {
        return (int)(*(ulong *)((long)bv + 8) < *(ulong *)((long)av + 8));
      }
    }
  }
  return iVar1;
}

Assistant:

static int compare_timers(void *av, void *bv)
{
    struct timer *a = (struct timer *)av;
    struct timer *b = (struct timer *)bv;
    long at = a->now - now;
    long bt = b->now - now;

    if (at < bt)
        return -1;
    else if (at > bt)
        return +1;

    /*
     * Failing that, compare on the other two fields, just so that
     * we don't get unwanted equality.
     */
#if defined(__LCC__) || defined(__clang__)
    /* lcc won't let us compare function pointers. Legal, but annoying. */
    {
        int c = memcmp(&a->fn, &b->fn, sizeof(a->fn));
        if (c)
            return c;
    }
#else
    if (a->fn < b->fn)
        return -1;
    else if (a->fn > b->fn)
        return +1;
#endif

    if (a->ctx < b->ctx)
        return -1;
    else if (a->ctx > b->ctx)
        return +1;

    /*
     * Failing _that_, the two entries genuinely are equal, and we
     * never have a need to store them separately in the tree.
     */
    return 0;
}